

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurfaceAccess.cpp
# Opt level: O1

void __thiscall
tcu::SurfaceAccess::SurfaceAccess(SurfaceAccess *this,Surface *surface,PixelFormat *colorFmt)

{
  this->m_surface = surface;
  this->m_colorMask =
       (colorFmt->alphaBits != 0) << 3 |
       (colorFmt->blueBits != 0) << 2 | (colorFmt->greenBits != 0) * '\x02' | colorFmt->redBits != 0
  ;
  this->m_x = 0;
  this->m_y = 0;
  this->m_width = surface->m_width;
  this->m_height = surface->m_height;
  return;
}

Assistant:

SurfaceAccess::SurfaceAccess (tcu::Surface& surface, const tcu::PixelFormat& colorFmt)
	: m_surface		(&surface)
	, m_colorMask	(getColorMask(colorFmt))
	, m_x			(0)
	, m_y			(0)
	, m_width		(surface.getWidth())
	, m_height		(surface.getHeight())
{
}